

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O2

bool __thiscall Control::activate(Control *this,bool makeChange,ostream *msgLog)

{
  double dVar1;
  uint uVar2;
  Link *pLVar3;
  undefined1 uVar4;
  undefined7 in_register_00000031;
  string *this_00;
  string local_140 [32];
  string local_120 [32];
  string local_100;
  undefined1 local_e0 [8];
  string linkStr;
  undefined1 local_98 [8];
  string reason;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_34;
  int iVar5;
  
  std::__cxx11::string::string((string *)local_98,"",(allocator *)local_e0);
  (*(this->link->super_Element)._vptr_Element[3])(&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&reason.field_2 + 8),&local_58," ");
  local_34 = (undefined4)CONCAT71(in_register_00000031,makeChange);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&reason.field_2 + 8),&(this->link->super_Element).name);
  std::__cxx11::string::~string((string *)(reason.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reason.field_2 + 8),&s_TankLevel_abi_cxx11_,
                   &(this->node->super_Element).name);
    break;
  case 1:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reason.field_2 + 8),&s_PressureLevel_abi_cxx11_,
                   &(this->node->super_Element).name);
    break;
  case 2:
    goto LAB_0012b87b;
  case 3:
LAB_0012b87b:
    std::__cxx11::string::_M_assign((string *)local_98);
  default:
    goto switchD_0012b84f_default;
  }
  std::__cxx11::string::operator=((string *)local_98,(string *)(reason.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(reason.field_2._M_local_buf + 8));
switchD_0012b84f_default:
  if (this->status == 2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &s_SettingChanged_abi_cxx11_);
    Utilities::to_string<double>(&local_100,&this->setting);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),&local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reason.field_2 + 8),&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::__cxx11::string::operator=((string *)local_98,(string *)(reason.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(reason.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)(linkStr.field_2._M_local_buf + 8));
    pLVar3 = this->link;
    dVar1 = this->setting;
    this_00 = local_120;
    std::__cxx11::string::string(this_00,(string *)local_98);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1b])
                      (dVar1,pLVar3,(ulong)(byte)local_34,this_00,msgLog);
    uVar4 = (undefined1)iVar5;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &s_StatusChanged_abi_cxx11_);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkStr.field_2 + 8),statusTxt_abi_cxx11_ + this->status);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reason.field_2 + 8),&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    std::__cxx11::string::operator=((string *)local_98,(string *)(reason.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(reason.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(linkStr.field_2._M_local_buf + 8));
    pLVar3 = this->link;
    uVar2 = this->status;
    this_00 = local_140;
    std::__cxx11::string::string(this_00,(string *)local_98);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1a])
                      (pLVar3,(ulong)uVar2,(ulong)(byte)local_34,this_00,msgLog);
    uVar4 = (undefined1)iVar5;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_98);
  return (bool)uVar4;
}

Assistant:

bool Control::activate(bool makeChange, ostream& msgLog)
{
    bool   result = false;
    string reason = "";
    string linkStr = link->typeStr() + " " + link->name;

    switch (type)
    {
    case TANK_LEVEL:
        reason = s_TankLevel + node->name;
        break;

    case PRESSURE_LEVEL:
        reason = s_PressureLevel + node->name;
        break;

    case ELAPSED_TIME:
        reason = s_ElapsedTime;
        break;

    case TIME_OF_DAY:
        reason = s_TimeOfDay;
        break;
    }

    if ( status != NO_STATUS )
    {
        reason =  linkStr + s_StatusChanged + statusTxt[status] + reason;
        result = link->changeStatus(status, makeChange, reason, msgLog);
    }
    else
    {
        reason = linkStr + s_SettingChanged + Utilities::to_string(setting) +
            reason;
        result = link->changeSetting(setting, makeChange, reason, msgLog);
    }
    return result;
}